

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O3

void __thiscall
Diligent::GLProgram::GLProgram
          (GLProgram *this,ShaderGLImpl **ppShaders,Uint32 NumShaders,bool IsSeparableProgram)

{
  ulong uVar1;
  GLenum err;
  string msg;
  uint local_5c;
  string local_58;
  ulong local_38;
  
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::GLObjWrapper
            (&this->m_GLProg,1);
  local_38 = (ulong)NumShaders;
  std::vector<Diligent::ShaderGLImpl_const*,std::allocator<Diligent::ShaderGLImpl_const*>>::
  vector<Diligent::ShaderGLImpl*const*,void>
            ((vector<Diligent::ShaderGLImpl_const*,std::allocator<Diligent::ShaderGLImpl_const*>> *)
             &this->m_AttachedShaders,ppShaders,ppShaders + local_38,(allocator_type *)&local_58);
  (this->m_InfoLog)._M_dataplus._M_p = (pointer)&(this->m_InfoLog).field_2;
  (this->m_InfoLog)._M_string_length = 0;
  (this->m_InfoLog).field_2._M_local_buf[0] = '\0';
  this->m_LinkStatus = Undefined;
  this->m_BindingsApplied = false;
  (this->m_pResources).
  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_pResources).
  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)(this->m_DbgBaseBindings)._M_elems = 0;
  if (IsSeparableProgram && NumShaders != 1) {
    FormatString<char[62]>
              (&local_58,
               (char (*) [62])"Number of shaders must be 1 when separable program is created");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x29);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (IsSeparableProgram) {
    (*__glewProgramParameteri)((this->m_GLProg).m_uiHandle,0x8258,1);
    local_5c = glGetError();
    if (local_5c != 0) {
      LogError<false,char[49],char[17],unsigned_int>
                (false,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x2f,(char (*) [49])"glProgramParameteri(GL_PROGRAM_SEPARABLE) failed",
                 (char (*) [17])"\nGL Error Code: ",&local_5c);
      FormatString<char[6]>(&local_58,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x2f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (NumShaders != 0) {
    uVar1 = 0;
    do {
      (*__glewAttachShader)
                ((this->m_GLProg).m_uiHandle,(ppShaders[uVar1]->m_GLShaderObj).m_uiHandle);
      local_5c = glGetError();
      if (local_5c != 0) {
        LogError<false,char[24],char[17],unsigned_int>
                  (false,"GLProgram",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                   ,0x36,(char (*) [24])"glAttachShader() failed",(char (*) [17])"\nGL Error Code: "
                   ,&local_5c);
        FormatString<char[6]>(&local_58,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"GLProgram",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                   ,0x36);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      uVar1 = uVar1 + 1;
    } while (local_38 != uVar1);
  }
  (*__glewLinkProgram)((this->m_GLProg).m_uiHandle);
  local_5c = glGetError();
  if (local_5c != 0) {
    LogError<false,char[23],char[17],unsigned_int>
              (false,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x44,(char (*) [23])"glLinkProgram() failed",(char (*) [17])"\nGL Error Code: ",
               &local_5c);
    FormatString<char[6]>(&local_58,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x44);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_LinkStatus = InProgress;
  return;
}

Assistant:

GLProgram::GLProgram(ShaderGLImpl* const* ppShaders,
                     Uint32               NumShaders,
                     bool                 IsSeparableProgram) noexcept :
    m_AttachedShaders{ppShaders, ppShaders + NumShaders}
{
    VERIFY(!IsSeparableProgram || NumShaders == 1, "Number of shaders must be 1 when separable program is created");

    // GL_PROGRAM_SEPARABLE parameter must be set before linking!
    if (IsSeparableProgram)
    {
        glProgramParameteri(m_GLProg, GL_PROGRAM_SEPARABLE, GL_TRUE);
        DEV_CHECK_GL_ERROR("glProgramParameteri(GL_PROGRAM_SEPARABLE) failed");
    }

    for (Uint32 i = 0; i < NumShaders; ++i)
    {
        auto* pCurrShader = ppShaders[i];
        glAttachShader(m_GLProg, pCurrShader->GetGLShaderHandle());
        DEV_CHECK_GL_ERROR("glAttachShader() failed");
    }

    //With separable program objects, interfaces between shader stages may
    //involve the outputs from one program object and the inputs from a
    //second program object. For such interfaces, it is not possible to
    //detect mismatches at link time, because the programs are linked
    //separately. When each such program is linked, all inputs or outputs
    //interfacing with another program stage are treated as active. The
    //linker will generate an executable that assumes the presence of a
    //compatible program on the other side of the interface. If a mismatch
    //between programs occurs, no GL error will be generated, but some or all
    //of the inputs on the interface will be undefined.
    glLinkProgram(m_GLProg);
    DEV_CHECK_GL_ERROR("glLinkProgram() failed");

    // Note: according to the spec, shaders can be detached immediately after glLinkProgram call.
    //       However, on NVidia GPUs this completely disables the GL_KHR_parallel_shader_compile
    //       extension, which barely works already. So we keep shaders attached until the program
    //       is linked.

    m_LinkStatus = LinkStatus::InProgress;
}